

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  byte bVar1;
  MessageLite *pMVar2;
  bool bVar3;
  int iVar4;
  Descriptor *pDVar5;
  undefined4 extraout_var;
  anon_union_8_9_fdc4a54a_for_Extension_0 aVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Extension *extension;
  Extension *local_38 [3];
  
  bVar3 = MaybeNewExtension(this,descriptor->number_,descriptor,local_38);
  if (bVar3) {
    bVar1 = descriptor->type_;
    local_38[0]->type = bVar1;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)bVar1 * 4) == 10) {
      local_38[0]->is_repeated = false;
      local_38[0]->field_0xa = local_38[0]->field_0xa | 1;
      local_38[0]->is_packed = false;
      pDVar5 = FieldDescriptor::message_type(descriptor);
      iVar4 = (*factory->_vptr_MessageFactory[2])(factory,pDVar5);
      local_38[0]->field_0xa = local_38[0]->field_0xa & 0xfb;
      aVar6 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              MessageLite::New((MessageLite *)CONCAT44(extraout_var,iVar4),this->arena_);
      local_38[0]->field_0 = aVar6;
      local_38[0]->field_0xa = local_38[0]->field_0xa & 0xfd;
      return (MessageLite *)(local_38[0]->field_0).int64_t_value;
    }
    MutableMessage();
  }
  else if (local_38[0]->is_repeated == false) {
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_38[0]->type * 4) == 10) {
      bVar1 = local_38[0]->field_0xa;
      local_38[0]->field_0xa = bVar1 & 0xfd;
      pMVar2 = (MessageLite *)(local_38[0]->field_0).int64_t_value;
      if ((bVar1 & 4) == 0) {
        return pMVar2;
      }
      pDVar5 = FieldDescriptor::message_type(descriptor);
      iVar4 = (*factory->_vptr_MessageFactory[2])(factory,pDVar5);
      iVar4 = (*pMVar2->_vptr_MessageLite[5])(pMVar2,CONCAT44(extraout_var_00,iVar4),this->arena_);
      return (MessageLite *)CONCAT44(extraout_var_01,iVar4);
    }
    goto LAB_001e0c38;
  }
  MutableMessage((ExtensionSet *)(local_38 + 1));
LAB_001e0c38:
  MutableMessage();
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(const FieldDescriptor* descriptor,
                                          MessageFactory* factory) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    ABSL_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_packed = false;
    const MessageLite* prototype =
        factory->GetPrototype(descriptor->message_type());
    extension->is_lazy = false;
    extension->ptr.message_value = prototype->New(arena_);
    extension->is_cleared = false;
    return extension->ptr.message_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->ptr.lazymessage_value->MutableMessage(
          *factory->GetPrototype(descriptor->message_type()), arena_);
    } else {
      return extension->ptr.message_value;
    }
  }
}